

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::rayleigh_dist<float>::icdf(rayleigh_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  int *piVar2;
  float fVar3;
  result_type_conflict1 rVar4;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar4 = NAN;
  }
  else {
    fVar1 = (this->P).nu_;
    fVar3 = logf(1.0 - x);
    fVar3 = fVar3 * -2.0;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    rVar4 = fVar1 * fVar3;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.nu() * math::sqrt(-2 * math::ln(1 - x));
    }